

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O1

void av1_fwd_txfm2d_4x4_sse4_1
               (int16_t *input,int32_t *coeff,int input_stride,TX_TYPE tx_type,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  char cVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  long lVar12;
  int8_t (*paiVar13) [5];
  undefined7 in_register_00000009;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined4 uVar36;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined4 uVar37;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 uVar38;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined4 uVar39;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int32_t iVar40;
  int iVar41;
  int iVar49;
  int iVar52;
  undefined1 in_XMM1 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int32_t iVar50;
  int32_t iVar53;
  int iVar55;
  int32_t iVar56;
  int iVar57;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar51;
  int iVar54;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar58;
  int iVar64;
  int iVar65;
  undefined1 in_XMM2 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar66;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  longlong lVar73;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar80;
  undefined1 auVar79 [16];
  longlong lVar81;
  undefined1 auVar82 [16];
  int32_t iVar83;
  int32_t iVar89;
  int32_t iVar90;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  int32_t iVar91;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  int32_t iVar102;
  int32_t iVar105;
  int32_t iVar106;
  undefined1 auVar103 [16];
  int32_t iVar107;
  undefined1 auVar104 [16];
  __m128i in [4];
  undefined1 local_58 [4];
  int iStack_54;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  __m128i alVar21;
  __m128i alVar24;
  __m128i alVar28;
  __m128i alVar32;
  
  if (0xf < (uint)CONCAT71(in_register_00000009,tx_type)) {
    return;
  }
  switch(CONCAT71(in_register_00000009,tx_type) & 0xffffffff) {
  case 0:
    iVar11 = (int)*av1_fwd_txfm_shift_ls[0];
    local_28._0_8_ = *(undefined8 *)(input + input_stride * 3);
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_28._0_8_;
    auVar27 = pmovsxwd(auVar18,*(undefined8 *)input);
    auVar26 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar44 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,local_28._0_8_);
    iVar49 = auVar27._0_4_ << iVar11;
    iVar52 = auVar26._0_4_ << iVar11;
    iVar55 = auVar44._0_4_ << iVar11;
    iVar11 = auVar61._0_4_ << iVar11;
    auVar101 = ZEXT416(0xd);
    auVar97._8_4_ = 0x16a1;
    auVar97._0_8_ = 0x16a1000016a1;
    auVar97._12_4_ = 0x16a1;
    auVar84._8_4_ = 0xc3f;
    auVar84._0_8_ = 0xc3f00000c3f;
    auVar84._12_4_ = 0xc3f;
    auVar92._8_4_ = 0x1d90;
    auVar92._0_8_ = 0x1d9000001d90;
    auVar92._12_4_ = 0x1d90;
    auVar74._0_4_ = iVar11 + iVar49;
    auVar74._4_4_ = auVar61._4_4_ + auVar27._4_4_;
    auVar74._8_4_ = auVar61._8_4_ + auVar27._8_4_;
    auVar74._12_4_ = auVar61._12_4_ + auVar27._12_4_;
    auVar19._0_4_ = iVar49 - iVar11;
    auVar19._4_4_ = auVar27._4_4_ - auVar61._4_4_;
    auVar19._8_4_ = auVar27._8_4_ - auVar61._8_4_;
    auVar19._12_4_ = auVar27._12_4_ - auVar61._12_4_;
    auVar67._0_4_ = iVar55 + iVar52;
    auVar67._4_4_ = auVar44._4_4_ + auVar26._4_4_;
    auVar67._8_4_ = auVar44._8_4_ + auVar26._8_4_;
    auVar67._12_4_ = auVar44._12_4_ + auVar26._12_4_;
    auVar42._0_4_ = iVar52 - iVar55;
    auVar42._4_4_ = auVar26._4_4_ - auVar44._4_4_;
    auVar42._8_4_ = auVar26._8_4_ - auVar44._8_4_;
    auVar42._12_4_ = auVar26._12_4_ - auVar44._12_4_;
    auVar69 = pmulld(auVar74,auVar97);
    auVar44 = pmulld(auVar67,auVar97);
    iVar11 = auVar69._0_4_ + 0x1000;
    iVar49 = auVar69._8_4_ + 0x1000;
    auVar61 = pmulld(auVar84,auVar42);
    auVar26 = pmulld(auVar42,auVar92);
    auVar99 = pmulld(auVar92,auVar19);
    auVar27 = pmulld(auVar19,auVar84);
    iStack_54 = auVar61._0_4_ + 0x1000 + auVar99._0_4_ >> auVar101;
    local_58 = (undefined1  [4])(iVar11 + auVar44._0_4_ >> auVar101);
    uStack_50._4_4_ = (auVar27._0_4_ + 0x1000) - auVar26._0_4_ >> auVar101;
    uStack_50._0_4_ = iVar11 - auVar44._0_4_ >> auVar101;
    local_48._8_4_ = auVar69._4_4_ + 0x1000 + auVar44._4_4_ >> auVar101;
    local_48._0_8_ = *(undefined8 *)(input + input_stride);
    local_48._12_4_ = auVar61._4_4_ + 0x1000 + auVar99._4_4_ >> auVar101;
    local_38._4_4_ = auVar61._8_4_ + 0x1000 + auVar99._8_4_ >> auVar101;
    local_38._0_4_ = iVar49 + auVar44._8_4_ >> auVar101;
    local_38._8_4_ = iVar49 - auVar44._8_4_ >> auVar101;
    local_38._12_4_ = (auVar27._8_4_ + 0x1000) - auVar26._8_4_ >> auVar101;
    local_28._8_4_ = auVar69._12_4_ + 0x1000 + auVar44._12_4_ >> auVar101;
    local_28._12_4_ = auVar61._12_4_ + 0x1000 + auVar99._12_4_ >> auVar101;
    goto LAB_00417251;
  case 1:
    cVar5 = *av1_fwd_txfm_shift_ls[0];
    uVar1 = *(undefined8 *)input;
    uVar2 = *(undefined8 *)(input + input_stride);
    uVar3 = *(undefined8 *)(input + input_stride * 2);
    uVar4 = *(ulong *)(input + input_stride * 3);
    goto LAB_004177ff;
  case 2:
    iVar11 = (int)*av1_fwd_txfm_shift_ls[0];
    local_48._0_8_ = *(undefined8 *)(input + input_stride);
    local_28._0_8_ = *(undefined8 *)(input + input_stride * 3);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_28._0_8_;
    auVar26 = pmovsxwd(auVar25,*(undefined8 *)input);
    auVar44 = pmovsxwd(in_XMM1,local_48._0_8_);
    auVar61 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar27 = pmovsxwd(in_XMM3,local_28._0_8_);
    iVar49 = auVar26._0_4_ << iVar11;
    iVar52 = auVar26._4_4_;
    iVar55 = auVar26._8_4_;
    iVar80 = auVar26._12_4_;
    iVar41 = auVar44._0_4_ << iVar11;
    iVar51 = auVar44._4_4_;
    iVar54 = auVar44._8_4_;
    iVar57 = auVar44._12_4_;
    iVar58 = auVar61._0_4_ << iVar11;
    iVar64 = auVar61._4_4_;
    iVar65 = auVar61._8_4_;
    iVar66 = auVar61._12_4_;
    goto LAB_00417a40;
  case 3:
    cVar5 = *av1_fwd_txfm_shift_ls[0];
    uVar1 = *(undefined8 *)input;
    uVar2 = *(undefined8 *)(input + input_stride);
    uVar3 = *(undefined8 *)(input + input_stride * 2);
    uVar4 = *(ulong *)(input + input_stride * 3);
    goto LAB_00417eee;
  case 4:
    cVar5 = *av1_fwd_txfm_shift_ls[0];
    uVar1 = *(undefined8 *)(input + input_stride * 3);
    uVar2 = *(undefined8 *)(input + input_stride * 2);
    uVar3 = *(undefined8 *)(input + input_stride);
    uVar4 = *(ulong *)input;
LAB_004177ff:
    iVar11 = (int)cVar5;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar4;
    auVar27 = pmovsxwd(auVar22,uVar1);
    auVar26 = pmovsxwd(in_XMM1,uVar2);
    auVar44 = pmovsxwd(in_XMM2,uVar3);
    auVar61 = pmovsxwd(in_XMM3,uVar4);
    iStack_54 = auVar27._4_4_;
    local_58 = (undefined1  [4])(auVar27._0_4_ << iVar11);
    uStack_50._0_4_ = auVar27._8_4_;
    uStack_50._4_4_ = auVar27._12_4_;
    local_48._4_4_ = auVar26._4_4_;
    local_48._0_4_ = auVar26._0_4_ << iVar11;
    local_48._8_4_ = auVar26._8_4_;
    local_48._12_4_ = auVar26._12_4_;
    local_38._4_4_ = auVar44._4_4_;
    local_38._0_4_ = auVar44._0_4_ << iVar11;
    local_38._8_4_ = auVar44._8_4_;
    local_38._12_4_ = auVar44._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar11;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    fadst4x4_sse4_1((__m128i *)local_58,(__m128i *)local_58,0xd,1);
    auVar27 = ZEXT416(0xd);
    auVar86._8_4_ = 0x16a1;
    auVar86._0_8_ = 0x16a1000016a1;
    auVar86._12_4_ = 0x16a1;
    auVar76._8_4_ = 0xc3f;
    auVar76._0_8_ = 0xc3f00000c3f;
    auVar76._12_4_ = 0xc3f;
    auVar70._8_4_ = 0x1d90;
    auVar70._0_8_ = 0x1d9000001d90;
    auVar70._12_4_ = 0x1d90;
    auVar45._0_4_ = local_28._0_4_ + (int)local_58;
    auVar45._4_4_ = local_28._4_4_ + local_48._0_4_;
    auVar45._8_4_ = uStack_50._4_4_ + local_38._0_4_;
    auVar45._12_4_ = local_48._12_4_ + local_28._0_4_;
    auVar62._0_4_ = (int)local_58 - local_28._0_4_;
    auVar62._4_4_ = local_48._0_4_ - local_28._4_4_;
    auVar62._8_4_ = local_38._0_4_ - uStack_50._4_4_;
    auVar62._12_4_ = local_28._0_4_ - local_48._12_4_;
    auVar104._0_4_ = (int)uStack_50 + local_48._0_4_;
    auVar104._4_4_ = local_48._8_4_ + local_48._4_4_;
    auVar104._8_4_ = local_38._8_4_ + iStack_54;
    auVar104._12_4_ = local_28._8_4_ + local_48._4_4_;
    auVar94._0_4_ = local_48._0_4_ - (int)uStack_50;
    auVar94._4_4_ = local_48._4_4_ - local_48._8_4_;
    auVar94._8_4_ = iStack_54 - local_38._8_4_;
    auVar94._12_4_ = local_48._4_4_ - local_28._8_4_;
    auVar26 = pmulld(auVar45,auVar86);
    auVar44 = pmulld(auVar104,auVar86);
    iVar11 = auVar26._0_4_ + 0x1000;
    iVar49 = auVar26._4_4_ + 0x1000;
    iVar52 = auVar26._8_4_ + 0x1000;
    iVar55 = auVar26._12_4_ + 0x1000;
    iVar83 = auVar44._0_4_ + iVar11 >> auVar27;
    iVar89 = auVar44._4_4_ + iVar49 >> auVar27;
    iVar90 = auVar44._8_4_ + iVar52 >> auVar27;
    iVar91 = auVar44._12_4_ + iVar55 >> auVar27;
    iVar40 = iVar11 - auVar44._0_4_ >> auVar27;
    iVar50 = iVar49 - auVar44._4_4_ >> auVar27;
    iVar53 = iVar52 - auVar44._8_4_ >> auVar27;
    iVar56 = iVar55 - auVar44._12_4_ >> auVar27;
    auVar26 = pmulld(auVar94,auVar76);
    auVar44 = pmulld(auVar62,auVar70);
    iVar102 = auVar44._0_4_ + 0x1000 + auVar26._0_4_ >> auVar27;
    iVar105 = auVar44._4_4_ + 0x1000 + auVar26._4_4_ >> auVar27;
    iVar106 = auVar44._8_4_ + 0x1000 + auVar26._8_4_ >> auVar27;
    iVar107 = auVar44._12_4_ + 0x1000 + auVar26._12_4_ >> auVar27;
    auVar26 = pmulld(auVar62,auVar76);
    auVar44 = pmulld(auVar94,auVar70);
    local_28._4_4_ = (auVar26._4_4_ + 0x1000) - auVar44._4_4_ >> auVar27;
    local_28._0_4_ = (auVar26._0_4_ + 0x1000) - auVar44._0_4_ >> auVar27;
    local_28._8_4_ = (auVar26._8_4_ + 0x1000) - auVar44._8_4_ >> auVar27;
    local_28._12_4_ = (auVar26._12_4_ + 0x1000) - auVar44._12_4_ >> auVar27;
    goto LAB_004179b2;
  case 5:
    iVar11 = (int)*av1_fwd_txfm_shift_ls[0];
    uStack_50 = 0;
    _local_58 = *(ulong *)input;
    local_48._0_8_ = *(undefined8 *)(input + input_stride);
    local_48._8_8_ = 0;
    local_38._8_8_ = 0;
    local_38._0_8_ = *(ulong *)(input + input_stride * 2);
    local_28._0_8_ = *(undefined8 *)(input + input_stride * 3);
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_28._0_8_;
    auVar27 = pshuflw(auVar30,(undefined1  [16])_local_58,0x1b);
    auVar26 = pshuflw(in_XMM1,local_48,0x1b);
    auVar44 = pshuflw(in_XMM2,local_38,0x1b);
    auVar61 = pshuflw(in_XMM3,auVar30,0x1b);
    auVar27 = pmovsxwd(auVar27,auVar27);
    auVar26 = pmovsxwd(auVar26,auVar26);
    auVar44 = pmovsxwd(auVar44,auVar44);
    iVar49 = auVar27._0_4_ << iVar11;
    iVar52 = auVar27._4_4_;
    iVar55 = auVar27._8_4_;
    iVar80 = auVar27._12_4_;
    iVar41 = auVar26._0_4_ << iVar11;
    iVar51 = auVar26._4_4_;
    iVar54 = auVar26._8_4_;
    iVar57 = auVar26._12_4_;
    iVar58 = auVar44._0_4_ << iVar11;
    iVar64 = auVar44._4_4_;
    iVar65 = auVar44._8_4_;
    iVar66 = auVar44._12_4_;
    auVar27 = pmovsxwd(auVar61,auVar61);
LAB_00417a40:
    iVar11 = auVar27._0_4_ << iVar11;
    auVar101 = ZEXT416(0xd);
    auVar95._8_4_ = 0x16a1;
    auVar95._0_8_ = 0x16a1000016a1;
    auVar95._12_4_ = 0x16a1;
    auVar87._8_4_ = 0xc3f;
    auVar87._0_8_ = 0xc3f00000c3f;
    auVar87._12_4_ = 0xc3f;
    auVar98._8_4_ = 0x1d90;
    auVar98._0_8_ = 0x1d9000001d90;
    auVar98._12_4_ = 0x1d90;
    auVar77._0_4_ = iVar11 + iVar49;
    auVar77._4_4_ = auVar27._4_4_ + iVar52;
    auVar77._8_4_ = auVar27._8_4_ + iVar55;
    auVar77._12_4_ = auVar27._12_4_ + iVar80;
    auVar31._0_4_ = iVar49 - iVar11;
    auVar31._4_4_ = iVar52 - auVar27._4_4_;
    auVar31._8_4_ = iVar55 - auVar27._8_4_;
    auVar31._12_4_ = iVar80 - auVar27._12_4_;
    auVar71._0_4_ = iVar58 + iVar41;
    auVar71._4_4_ = iVar64 + iVar51;
    auVar71._8_4_ = iVar65 + iVar54;
    auVar71._12_4_ = iVar66 + iVar57;
    auVar46._0_4_ = iVar41 - iVar58;
    auVar46._4_4_ = iVar51 - iVar64;
    auVar46._8_4_ = iVar54 - iVar65;
    auVar46._12_4_ = iVar57 - iVar66;
    auVar69 = pmulld(auVar77,auVar95);
    auVar44 = pmulld(auVar71,auVar95);
    iVar11 = auVar69._0_4_ + 0x1000;
    iVar49 = auVar69._8_4_ + 0x1000;
    auVar61 = pmulld(auVar87,auVar46);
    auVar26 = pmulld(auVar46,auVar98);
    auVar99 = pmulld(auVar98,auVar31);
    auVar27 = pmulld(auVar31,auVar87);
    _local_58 = CONCAT44(auVar61._0_4_ + 0x1000 + auVar99._0_4_ >> auVar101,
                         iVar11 + auVar44._0_4_ >> auVar101);
    uStack_50 = CONCAT44((auVar27._0_4_ + 0x1000) - auVar26._0_4_ >> auVar101,
                         iVar11 - auVar44._0_4_ >> auVar101);
    local_48._8_4_ = auVar69._4_4_ + 0x1000 + auVar44._4_4_ >> auVar101;
    local_48._12_4_ = auVar61._4_4_ + 0x1000 + auVar99._4_4_ >> auVar101;
    local_38._4_4_ = auVar61._8_4_ + 0x1000 + auVar99._8_4_ >> auVar101;
    local_38._0_4_ = iVar49 + auVar44._8_4_ >> auVar101;
    local_38._8_4_ = iVar49 - auVar44._8_4_ >> auVar101;
    local_38._12_4_ = (auVar27._8_4_ + 0x1000) - auVar26._8_4_ >> auVar101;
    local_28._8_4_ = auVar69._12_4_ + 0x1000 + auVar44._12_4_ >> auVar101;
    local_28._12_4_ = auVar61._12_4_ + 0x1000 + auVar99._12_4_ >> auVar101;
LAB_00417fb1:
    paiVar13 = av1_fwd_cos_bit_row;
LAB_00417fb8:
    cVar5 = (*paiVar13)[0];
LAB_00417fbb:
    fadst4x4_sse4_1((__m128i *)local_58,(__m128i *)local_58,(int)cVar5,1);
    *(ulong *)coeff = _local_58;
    *(longlong *)(coeff + 2) = uStack_50;
    *(undefined8 *)(coeff + 4) = local_48._0_8_;
    *(undefined8 *)(coeff + 6) = local_48._8_8_;
    goto LAB_00417fe1;
  case 6:
    cVar5 = *av1_fwd_txfm_shift_ls[0];
    _local_58 = *(ulong *)(input + input_stride * 3);
    local_48._0_8_ = *(undefined8 *)(input + input_stride * 2);
    local_38._0_8_ = *(undefined8 *)(input + input_stride);
    uVar4 = *(ulong *)input;
    goto LAB_00417cb5;
  case 7:
    cVar5 = *av1_fwd_txfm_shift_ls[0];
    _local_58 = *(ulong *)input;
    local_48._0_8_ = *(undefined8 *)(input + input_stride);
    local_38._0_8_ = *(undefined8 *)(input + input_stride * 2);
    uVar4 = *(ulong *)(input + input_stride * 3);
LAB_00417cb5:
    local_38._8_8_ = 0;
    local_48._8_8_ = 0;
    uStack_50 = 0;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar4;
    auVar27 = pshuflw(auVar29,(undefined1  [16])_local_58,0x1b);
    auVar26 = pshuflw(in_XMM1,local_48,0x1b);
    auVar44 = pshuflw(in_XMM2,local_38,0x1b);
    auVar61 = pshuflw(in_XMM3,auVar29,0x1b);
    auVar27 = pmovsxwd(auVar27,auVar27);
    auVar26 = pmovsxwd(auVar26,auVar26);
    auVar44 = pmovsxwd(auVar44,auVar44);
    auVar61 = pmovsxwd(auVar61,auVar61);
    goto LAB_00417f0e;
  case 8:
    cVar5 = *av1_fwd_txfm_shift_ls[0];
    uVar1 = *(undefined8 *)(input + input_stride * 3);
    uVar2 = *(undefined8 *)(input + input_stride * 2);
    uVar3 = *(undefined8 *)(input + input_stride);
    uVar4 = *(ulong *)input;
LAB_00417eee:
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar4;
    auVar27 = pmovsxwd(auVar35,uVar1);
    auVar26 = pmovsxwd(in_XMM1,uVar2);
    auVar44 = pmovsxwd(in_XMM2,uVar3);
    auVar61 = pmovsxwd(in_XMM3,uVar4);
LAB_00417f0e:
    iVar11 = (int)cVar5;
    iStack_54 = auVar27._4_4_;
    local_58 = (undefined1  [4])(auVar27._0_4_ << iVar11);
    uStack_50._0_4_ = auVar27._8_4_;
    uStack_50._4_4_ = auVar27._12_4_;
    local_48._4_4_ = auVar26._4_4_;
    local_48._0_4_ = auVar26._0_4_ << iVar11;
    local_48._8_4_ = auVar26._8_4_;
    local_48._12_4_ = auVar26._12_4_;
    local_38._4_4_ = auVar44._4_4_;
    local_38._0_4_ = auVar44._0_4_ << iVar11;
    local_38._8_4_ = auVar44._8_4_;
    local_38._12_4_ = auVar44._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar11;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    fadst4x4_sse4_1((__m128i *)local_58,(__m128i *)local_58,0xd,1);
    uVar6 = local_48._4_4_;
    uVar7 = local_48._8_4_;
    uVar8 = local_48._12_4_;
    lVar73 = CONCAT44(local_48._0_4_,local_58);
    lVar81 = CONCAT44(local_28._0_4_,local_38._0_4_);
    local_48._8_4_ = iStack_54;
    local_48._12_4_ = uVar6;
    local_38._4_4_ = uVar7;
    local_38._0_4_ = (int)uStack_50;
    local_38._12_4_ = local_28._8_4_;
    local_28._8_4_ = uStack_50._4_4_;
    local_28._12_4_ = uVar8;
    _local_58 = lVar73;
    uStack_50 = lVar81;
    goto LAB_00417fb1;
  case 9:
    iVar11 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)(input + input_stride * 3);
    auVar27 = pmovsxwd(auVar23,*(undefined8 *)input);
    auVar26 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar44 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(ulong *)(input + input_stride * 3));
    iVar15 = auVar27._0_4_ << iVar11;
    uVar37 = auVar27._4_4_;
    alVar24[0] = CONCAT44(uVar37,iVar15);
    alVar24[1]._0_4_ = auVar27._8_4_;
    alVar24[1]._4_4_ = auVar27._12_4_;
    _local_58 = alVar24[0];
    uStack_50 = alVar24[1];
    local_48._0_4_ = auVar26._0_4_ << iVar11;
    local_48._4_4_ = auVar26._4_4_;
    local_48._8_4_ = auVar26._8_4_;
    local_48._12_4_ = auVar26._12_4_;
    local_38._4_4_ = auVar44._4_4_;
    local_38._0_4_ = auVar44._0_4_ << iVar11;
    local_38._8_4_ = auVar44._8_4_;
    local_38._12_4_ = auVar44._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar11;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    lVar12 = 0;
    auVar27 = pmovsxwd((undefined1  [16])alVar24,0x16a116a116a116a1);
    auVar26 = pmovsxwd(local_48,0x800080008000800);
    do {
      auVar44 = pmulld(*(undefined1 (*) [16])(local_58 + lVar12),auVar27);
      *(int *)(local_58 + lVar12) = auVar44._0_4_ + auVar26._0_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 4) = auVar44._4_4_ + auVar26._4_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 8) = auVar44._8_4_ + auVar26._8_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 0xc) = auVar44._12_4_ + auVar26._12_4_ >> 0xc;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    iVar11 = iStack_54;
    uVar6 = (int)uStack_50;
    uVar7 = uStack_50._4_4_;
    uVar8 = local_48._4_4_;
    uVar9 = local_48._8_4_;
    uVar10 = local_48._12_4_;
    iStack_54 = local_48._0_4_;
    uStack_50._4_4_ = local_28._0_4_;
    uStack_50._0_4_ = local_38._0_4_;
    local_48._8_4_ = iVar11;
    local_48._12_4_ = uVar8;
    local_38._4_4_ = uVar9;
    local_38._0_4_ = uVar6;
    local_38._12_4_ = local_28._8_4_;
    local_28._8_4_ = uVar7;
    local_28._12_4_ = uVar10;
    lVar12 = 0;
    do {
      auVar44 = pmulld(*(undefined1 (*) [16])(local_58 + lVar12),auVar27);
      *(int *)(local_58 + lVar12) = auVar44._0_4_ + auVar26._0_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 4) = auVar44._4_4_ + auVar26._4_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 8) = auVar44._8_4_ + auVar26._8_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 0xc) = auVar44._12_4_ + auVar26._12_4_ >> 0xc;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    break;
  case 10:
    iVar11 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *(ulong *)(input + input_stride * 3);
    auVar27 = pmovsxwd(auVar33,*(undefined8 *)input);
    auVar26 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar44 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(ulong *)(input + input_stride * 3));
    iVar49 = auVar27._0_4_ << iVar11;
    iVar52 = auVar26._0_4_ << iVar11;
    iVar55 = auVar44._0_4_ << iVar11;
    iVar11 = auVar61._0_4_ << iVar11;
    auVar69 = ZEXT416(0xd);
    auVar96._8_4_ = 0x16a1;
    auVar96._0_8_ = 0x16a1000016a1;
    auVar96._12_4_ = 0x16a1;
    auVar88._8_4_ = 0xc3f;
    auVar88._0_8_ = 0xc3f00000c3f;
    auVar88._12_4_ = 0xc3f;
    auVar100._8_4_ = 0x1d90;
    auVar100._0_8_ = 0x1d9000001d90;
    auVar100._12_4_ = 0x1d90;
    auVar78._0_4_ = iVar11 + iVar49;
    auVar78._4_4_ = auVar61._4_4_ + auVar27._4_4_;
    auVar78._8_4_ = auVar61._8_4_ + auVar27._8_4_;
    auVar78._12_4_ = auVar61._12_4_ + auVar27._12_4_;
    auVar34._0_4_ = iVar49 - iVar11;
    auVar34._4_4_ = auVar27._4_4_ - auVar61._4_4_;
    auVar34._8_4_ = auVar27._8_4_ - auVar61._8_4_;
    auVar34._12_4_ = auVar27._12_4_ - auVar61._12_4_;
    auVar72._0_4_ = iVar55 + iVar52;
    auVar72._4_4_ = auVar44._4_4_ + auVar26._4_4_;
    auVar72._8_4_ = auVar44._8_4_ + auVar26._8_4_;
    auVar72._12_4_ = auVar44._12_4_ + auVar26._12_4_;
    auVar47._0_4_ = iVar52 - iVar55;
    auVar47._4_4_ = auVar26._4_4_ - auVar44._4_4_;
    auVar47._8_4_ = auVar26._8_4_ - auVar44._8_4_;
    auVar47._12_4_ = auVar26._12_4_ - auVar44._12_4_;
    auVar27 = pmulld(auVar78,auVar96);
    auVar44 = pmulld(auVar72,auVar96);
    iVar49 = auVar27._0_4_ + 0x1000;
    iVar52 = auVar27._4_4_ + 0x1000;
    iVar55 = auVar27._8_4_ + 0x1000;
    iVar80 = auVar27._12_4_ + 0x1000;
    local_58 = (undefined1  [4])(iVar49 + auVar44._0_4_ >> auVar69);
    iVar11 = iVar52 + auVar44._4_4_ >> auVar69;
    auVar48._4_4_ = iVar11;
    auVar48._0_4_ = local_58;
    uStack_50._0_4_ = iVar49 - auVar44._0_4_ >> auVar69;
    iVar49 = iVar52 - auVar44._4_4_ >> auVar69;
    auVar82._4_4_ = iVar49;
    auVar82._0_4_ = (int)uStack_50;
    auVar61 = pmulld(auVar88,auVar47);
    auVar26 = pmulld(auVar47,auVar100);
    auVar101 = pmulld(auVar100,auVar34);
    auVar27 = pmulld(auVar34,auVar88);
    auVar48._8_4_ = iVar11;
    auVar48._12_4_ = auVar61._4_4_ + 0x1000 + auVar101._4_4_ >> auVar69;
    iStack_54 = auVar61._0_4_ + 0x1000 + auVar101._0_4_ >> auVar69;
    auVar82._8_4_ = iVar49;
    auVar82._12_4_ = (auVar27._4_4_ + 0x1000) - auVar26._4_4_ >> auVar69;
    uStack_50._4_4_ = (auVar27._0_4_ + 0x1000) - auVar26._0_4_ >> auVar69;
    auVar63._0_8_ =
         CONCAT44(auVar61._8_4_ + 0x1000 + auVar101._8_4_ >> auVar69,
                  iVar55 + auVar44._8_4_ >> auVar69);
    auVar63._8_4_ = iVar80 + auVar44._12_4_ >> auVar69;
    auVar63._12_4_ = auVar61._12_4_ + 0x1000 + auVar101._12_4_ >> auVar69;
    auVar79._0_8_ =
         CONCAT44((auVar27._8_4_ + 0x1000) - auVar26._8_4_ >> auVar69,
                  iVar55 - auVar44._8_4_ >> auVar69);
    auVar79._8_4_ = iVar80 - auVar44._12_4_ >> auVar69;
    auVar79._12_4_ = (auVar27._12_4_ + 0x1000) - auVar26._12_4_ >> auVar69;
    local_48._8_8_ = auVar82._8_8_;
    local_48._0_8_ = auVar48._8_8_;
    local_38._8_8_ = auVar79._0_8_;
    local_38._0_8_ = auVar63._0_8_;
    local_28._8_8_ = auVar79._8_8_;
    local_28._0_8_ = auVar63._8_8_;
    lVar12 = 0;
    auVar27 = pmovsxwd(local_38,0x16a116a116a116a1);
    auVar26 = pmovsxwd(local_48,0x800080008000800);
    do {
      auVar44 = pmulld(*(undefined1 (*) [16])(local_58 + lVar12),auVar27);
      *(int *)(local_58 + lVar12) = auVar44._0_4_ + auVar26._0_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 4) = auVar44._4_4_ + auVar26._4_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 8) = auVar44._8_4_ + auVar26._8_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 0xc) = auVar44._12_4_ + auVar26._12_4_ >> 0xc;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    break;
  case 0xb:
    iVar11 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)(input + input_stride * 3);
    auVar27 = pmovsxwd(auVar20,*(undefined8 *)input);
    auVar26 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar44 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(ulong *)(input + input_stride * 3));
    iVar14 = auVar27._0_4_ << iVar11;
    uVar36 = auVar27._4_4_;
    alVar21[0] = CONCAT44(uVar36,iVar14);
    alVar21[1]._0_4_ = auVar27._8_4_;
    alVar21[1]._4_4_ = auVar27._12_4_;
    _local_58 = alVar21[0];
    uStack_50 = alVar21[1];
    local_48._0_4_ = auVar26._0_4_ << iVar11;
    local_48._4_4_ = auVar26._4_4_;
    local_48._8_4_ = auVar26._8_4_;
    local_48._12_4_ = auVar26._12_4_;
    local_38._4_4_ = auVar44._4_4_;
    local_38._0_4_ = auVar44._0_4_ << iVar11;
    local_38._8_4_ = auVar44._8_4_;
    local_38._12_4_ = auVar44._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar11;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    lVar12 = 0;
    auVar27 = pmovsxwd((undefined1  [16])alVar21,0x16a116a116a116a1);
    auVar26 = pmovsxwd(local_48,0x800080008000800);
    do {
      auVar44 = pmulld(*(undefined1 (*) [16])(local_58 + lVar12),auVar27);
      *(int *)(local_58 + lVar12) = auVar44._0_4_ + auVar26._0_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 4) = auVar44._4_4_ + auVar26._4_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 8) = auVar44._8_4_ + auVar26._8_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 0xc) = auVar44._12_4_ + auVar26._12_4_ >> 0xc;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    iVar11 = iStack_54;
    uVar6 = (int)uStack_50;
    uVar7 = uStack_50._4_4_;
    uVar8 = local_48._4_4_;
    uVar9 = local_48._8_4_;
    uVar10 = local_48._12_4_;
    iStack_54 = local_48._0_4_;
    uStack_50._4_4_ = local_28._0_4_;
    uStack_50._0_4_ = local_38._0_4_;
    local_48._8_4_ = iVar11;
    local_48._12_4_ = uVar8;
    local_38._4_4_ = uVar9;
    local_38._0_4_ = uVar6;
    local_38._12_4_ = local_28._8_4_;
    local_28._8_4_ = uVar7;
    local_28._12_4_ = uVar10;
LAB_00417251:
    auVar85._8_4_ = 0x16a1;
    auVar85._0_8_ = 0x16a1000016a1;
    auVar75._8_4_ = 0xc3f;
    auVar75._0_8_ = 0xc3f00000c3f;
    auVar68._8_4_ = 0x1d90;
    auVar68._0_8_ = 0x1d9000001d90;
    auVar85._12_4_ = 0x16a1;
    auVar75._12_4_ = 0xc3f;
    auVar68._12_4_ = 0x1d90;
    auVar27 = ZEXT416(0xd);
    auVar43._0_4_ = local_28._0_4_ + (int)local_58;
    auVar43._4_4_ = local_28._4_4_ + iStack_54;
    auVar43._8_4_ = local_28._8_4_ + (int)uStack_50;
    auVar43._12_4_ = local_28._12_4_ + uStack_50._4_4_;
    auVar59._0_4_ = (int)local_58 - local_28._0_4_;
    auVar59._4_4_ = iStack_54 - local_28._4_4_;
    auVar59._8_4_ = (int)uStack_50 - local_28._8_4_;
    auVar59._12_4_ = uStack_50._4_4_ - local_28._12_4_;
    auVar103._0_4_ = local_38._0_4_ + local_48._0_4_;
    auVar103._4_4_ = local_38._4_4_ + local_48._4_4_;
    auVar103._8_4_ = local_38._8_4_ + local_48._8_4_;
    auVar103._12_4_ = local_38._12_4_ + local_48._12_4_;
    auVar93._0_4_ = local_48._0_4_ - local_38._0_4_;
    auVar93._4_4_ = local_48._4_4_ - local_38._4_4_;
    auVar93._8_4_ = local_48._8_4_ - local_38._8_4_;
    auVar93._12_4_ = local_48._12_4_ - local_38._12_4_;
    auVar26 = pmulld(auVar43,auVar85);
    auVar44 = pmulld(auVar103,auVar85);
    iVar11 = auVar26._0_4_ + 0x1000;
    iVar49 = auVar26._4_4_ + 0x1000;
    iVar52 = auVar26._8_4_ + 0x1000;
    iVar55 = auVar26._12_4_ + 0x1000;
    iVar83 = auVar44._0_4_ + iVar11 >> auVar27;
    iVar89 = auVar44._4_4_ + iVar49 >> auVar27;
    iVar90 = auVar44._8_4_ + iVar52 >> auVar27;
    iVar91 = auVar44._12_4_ + iVar55 >> auVar27;
    iVar40 = iVar11 - auVar44._0_4_ >> auVar27;
    iVar50 = iVar49 - auVar44._4_4_ >> auVar27;
    iVar53 = iVar52 - auVar44._8_4_ >> auVar27;
    iVar56 = iVar55 - auVar44._12_4_ >> auVar27;
    auVar26 = pmulld(auVar93,auVar75);
    auVar44 = pmulld(auVar59,auVar68);
    iVar102 = auVar44._0_4_ + 0x1000 + auVar26._0_4_ >> auVar27;
    iVar105 = auVar44._4_4_ + 0x1000 + auVar26._4_4_ >> auVar27;
    iVar106 = auVar44._8_4_ + 0x1000 + auVar26._8_4_ >> auVar27;
    iVar107 = auVar44._12_4_ + 0x1000 + auVar26._12_4_ >> auVar27;
    auVar26 = pmulld(auVar59,auVar75);
    auVar44 = pmulld(auVar93,auVar68);
    local_28._4_4_ = (auVar26._4_4_ + 0x1000) - auVar44._4_4_ >> auVar27;
    local_28._0_4_ = (auVar26._0_4_ + 0x1000) - auVar44._0_4_ >> auVar27;
    local_28._8_4_ = (auVar26._8_4_ + 0x1000) - auVar44._8_4_ >> auVar27;
    local_28._12_4_ = (auVar26._12_4_ + 0x1000) - auVar44._12_4_ >> auVar27;
LAB_004179b2:
    *coeff = iVar83;
    coeff[1] = iVar89;
    coeff[2] = iVar90;
    coeff[3] = iVar91;
    coeff[4] = iVar102;
    coeff[5] = iVar105;
    coeff[6] = iVar106;
    coeff[7] = iVar107;
    coeff[8] = iVar40;
    coeff[9] = iVar50;
    coeff[10] = iVar53;
    coeff[0xb] = iVar56;
    goto LAB_00417fe6;
  case 0xc:
    iVar11 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar101._8_8_ = 0;
    auVar101._0_8_ = *(ulong *)(input + input_stride * 3);
    auVar27 = pmovsxwd(auVar101,*(undefined8 *)input);
    auVar26 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar44 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(ulong *)(input + input_stride * 3));
    iStack_54 = auVar27._4_4_;
    local_58 = (undefined1  [4])(auVar27._0_4_ << iVar11);
    uStack_50._0_4_ = auVar27._8_4_;
    uStack_50._4_4_ = auVar27._12_4_;
    local_48._4_4_ = auVar26._4_4_;
    local_48._0_4_ = auVar26._0_4_ << iVar11;
    local_48._8_4_ = auVar26._8_4_;
    local_48._12_4_ = auVar26._12_4_;
    local_38._4_4_ = auVar44._4_4_;
    local_38._0_4_ = auVar44._0_4_ << iVar11;
    local_38._8_4_ = auVar44._8_4_;
    local_38._12_4_ = auVar44._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar11;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    fadst4x4_sse4_1((__m128i *)local_58,(__m128i *)local_58,0xd,1);
    iVar11 = iStack_54;
    uVar6 = (int)uStack_50;
    uVar7 = uStack_50._4_4_;
    uVar8 = local_48._4_4_;
    iStack_54 = local_48._0_4_;
    uStack_50._4_4_ = local_28._0_4_;
    uStack_50._0_4_ = local_38._0_4_;
    auVar99._0_8_ = CONCAT44(local_48._8_4_,uVar6);
    auVar99._8_4_ = uVar7;
    auVar99._12_4_ = local_48._12_4_;
    auVar60._0_8_ = CONCAT44(local_28._8_4_,local_38._8_4_);
    auVar60._8_4_ = local_38._12_4_;
    auVar60._12_4_ = local_28._12_4_;
    local_48._8_4_ = iVar11;
    local_48._12_4_ = uVar8;
    local_38._8_8_ = auVar60._0_8_;
    local_38._0_8_ = auVar99._0_8_;
    local_28._8_8_ = auVar60._8_8_;
    local_28._0_8_ = auVar99._8_8_;
    lVar12 = 0;
    auVar27 = pmovsxwd(local_28,0x16a116a116a116a1);
    auVar26 = pmovsxwd(local_38,0x800080008000800);
    do {
      auVar44 = pmulld(*(undefined1 (*) [16])(local_58 + lVar12),auVar27);
      *(int *)(local_58 + lVar12) = auVar44._0_4_ + auVar26._0_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 4) = auVar44._4_4_ + auVar26._4_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 8) = auVar44._8_4_ + auVar26._8_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 0xc) = auVar44._12_4_ + auVar26._12_4_ >> 0xc;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    break;
  case 0xd:
    iVar11 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar69._8_8_ = 0;
    auVar69._0_8_ = *(ulong *)(input + input_stride * 3);
    auVar27 = pmovsxwd(auVar69,*(undefined8 *)input);
    auVar26 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride));
    auVar44 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride * 2));
    auVar61 = pmovsxwd(in_XMM3,*(ulong *)(input + input_stride * 3));
    iVar17 = auVar27._0_4_ << iVar11;
    uVar39 = auVar27._4_4_;
    alVar32[0] = CONCAT44(uVar39,iVar17);
    alVar32[1]._0_4_ = auVar27._8_4_;
    alVar32[1]._4_4_ = auVar27._12_4_;
    _local_58 = alVar32[0];
    uStack_50 = alVar32[1];
    local_48._0_4_ = auVar26._0_4_ << iVar11;
    local_48._4_4_ = auVar26._4_4_;
    local_48._8_4_ = auVar26._8_4_;
    local_48._12_4_ = auVar26._12_4_;
    local_38._4_4_ = auVar44._4_4_;
    local_38._0_4_ = auVar44._0_4_ << iVar11;
    local_38._8_4_ = auVar44._8_4_;
    local_38._12_4_ = auVar44._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar11;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    lVar12 = 0;
    auVar27 = pmovsxwd((undefined1  [16])alVar32,0x16a116a116a116a1);
    auVar26 = pmovsxwd(local_48,0x800080008000800);
    do {
      auVar44 = pmulld(*(undefined1 (*) [16])(local_58 + lVar12),auVar27);
      *(int *)(local_58 + lVar12) = auVar44._0_4_ + auVar26._0_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 4) = auVar44._4_4_ + auVar26._4_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 8) = auVar44._8_4_ + auVar26._8_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 0xc) = auVar44._12_4_ + auVar26._12_4_ >> 0xc;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    uVar6 = local_48._4_4_;
    uVar7 = local_48._8_4_;
    uVar8 = local_48._12_4_;
    lVar73 = CONCAT44(local_48._0_4_,local_58);
    lVar81 = CONCAT44(local_28._0_4_,local_38._0_4_);
    local_48._8_4_ = iStack_54;
    local_48._12_4_ = uVar6;
    local_38._4_4_ = uVar7;
    local_38._0_4_ = (int)uStack_50;
    local_38._12_4_ = local_28._8_4_;
    local_28._8_4_ = uStack_50._4_4_;
    local_28._12_4_ = uVar8;
    paiVar13 = av1_fwd_cos_bit_col;
    _local_58 = lVar73;
    uStack_50 = lVar81;
    goto LAB_00417fb8;
  case 0xe:
    iVar11 = (int)*av1_fwd_txfm_shift_ls[0];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = *(ulong *)input;
    auVar27 = pmovsxwd(auVar26,*(undefined8 *)(input + input_stride * 3));
    auVar26 = pmovsxwd(in_XMM1,*(undefined8 *)(input + input_stride * 2));
    auVar44 = pmovsxwd(in_XMM2,*(undefined8 *)(input + input_stride));
    auVar61 = pmovsxwd(in_XMM3,*(ulong *)input);
    iStack_54 = auVar27._4_4_;
    local_58 = (undefined1  [4])(auVar27._0_4_ << iVar11);
    uStack_50._0_4_ = auVar27._8_4_;
    uStack_50._4_4_ = auVar27._12_4_;
    local_48._4_4_ = auVar26._4_4_;
    local_48._0_4_ = auVar26._0_4_ << iVar11;
    local_48._8_4_ = auVar26._8_4_;
    local_48._12_4_ = auVar26._12_4_;
    local_38._4_4_ = auVar44._4_4_;
    local_38._0_4_ = auVar44._0_4_ << iVar11;
    local_38._8_4_ = auVar44._8_4_;
    local_38._12_4_ = auVar44._12_4_;
    local_28._4_4_ = auVar61._4_4_;
    local_28._0_4_ = auVar61._0_4_ << iVar11;
    local_28._8_4_ = auVar61._8_4_;
    local_28._12_4_ = auVar61._12_4_;
    fadst4x4_sse4_1((__m128i *)local_58,(__m128i *)local_58,0xd,1);
    iVar11 = iStack_54;
    uVar6 = (int)uStack_50;
    uVar7 = uStack_50._4_4_;
    uVar8 = local_48._4_4_;
    iStack_54 = local_48._0_4_;
    uStack_50._4_4_ = local_28._0_4_;
    uStack_50._0_4_ = local_38._0_4_;
    auVar44._0_8_ = CONCAT44(local_48._8_4_,uVar6);
    auVar44._8_4_ = uVar7;
    auVar44._12_4_ = local_48._12_4_;
    auVar61._0_8_ = CONCAT44(local_28._8_4_,local_38._8_4_);
    auVar61._8_4_ = local_38._12_4_;
    auVar61._12_4_ = local_28._12_4_;
    local_48._8_4_ = iVar11;
    local_48._12_4_ = uVar8;
    local_38._8_8_ = auVar61._0_8_;
    local_38._0_8_ = auVar44._0_8_;
    local_28._8_8_ = auVar61._8_8_;
    local_28._0_8_ = auVar44._8_8_;
    lVar12 = 0;
    auVar27 = pmovsxwd(local_28,0x16a116a116a116a1);
    auVar26 = pmovsxwd(local_38,0x800080008000800);
    do {
      auVar44 = pmulld(*(undefined1 (*) [16])(local_58 + lVar12),auVar27);
      *(int *)(local_58 + lVar12) = auVar44._0_4_ + auVar26._0_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 4) = auVar44._4_4_ + auVar26._4_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 8) = auVar44._8_4_ + auVar26._8_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 0xc) = auVar44._12_4_ + auVar26._12_4_ >> 0xc;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    break;
  case 0xf:
    iVar11 = (int)*av1_fwd_txfm_shift_ls[0];
    uStack_50 = 0;
    _local_58 = *(ulong *)input;
    local_48._8_8_ = 0;
    local_48._0_8_ = *(ulong *)(input + input_stride);
    local_38._8_8_ = 0;
    local_38._0_8_ = *(ulong *)(input + input_stride * 2);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = *(ulong *)(input + input_stride * 3);
    auVar26 = pshuflw(auVar27,(undefined1  [16])_local_58,0x1b);
    auVar44 = pshuflw(in_XMM1,local_48,0x1b);
    auVar61 = pshuflw(in_XMM2,local_38,0x1b);
    auVar69 = pshuflw(in_XMM3,auVar27,0x1b);
    auVar27 = pmovsxwd(auVar26,auVar26);
    auVar26 = pmovsxwd(auVar44,auVar44);
    auVar44 = pmovsxwd(auVar61,auVar61);
    iVar16 = auVar27._0_4_ << iVar11;
    uVar38 = auVar27._4_4_;
    alVar28[0] = CONCAT44(uVar38,iVar16);
    alVar28[1]._0_4_ = auVar27._8_4_;
    alVar28[1]._4_4_ = auVar27._12_4_;
    auVar27 = pmovsxwd(auVar69,auVar69);
    _local_58 = alVar28[0];
    uStack_50 = alVar28[1];
    local_48._0_4_ = auVar26._0_4_ << iVar11;
    local_48._4_4_ = auVar26._4_4_;
    local_48._8_4_ = auVar26._8_4_;
    local_48._12_4_ = auVar26._12_4_;
    local_38._4_4_ = auVar44._4_4_;
    local_38._0_4_ = auVar44._0_4_ << iVar11;
    local_38._8_4_ = auVar44._8_4_;
    local_38._12_4_ = auVar44._12_4_;
    local_28._4_4_ = auVar27._4_4_;
    local_28._0_4_ = auVar27._0_4_ << iVar11;
    local_28._8_4_ = auVar27._8_4_;
    local_28._12_4_ = auVar27._12_4_;
    cVar5 = '\r';
    lVar12 = 0;
    auVar27 = pmovsxwd((undefined1  [16])alVar28,0x16a116a116a116a1);
    auVar26 = pmovsxwd(local_48,0x800080008000800);
    do {
      auVar44 = pmulld(*(undefined1 (*) [16])(local_58 + lVar12),auVar27);
      *(int *)(local_58 + lVar12) = auVar44._0_4_ + auVar26._0_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 4) = auVar44._4_4_ + auVar26._4_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 8) = auVar44._8_4_ + auVar26._8_4_ >> 0xc;
      *(int *)(local_58 + lVar12 + 0xc) = auVar44._12_4_ + auVar26._12_4_ >> 0xc;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    uVar6 = local_48._4_4_;
    uVar7 = local_48._8_4_;
    uVar8 = local_48._12_4_;
    lVar73 = CONCAT44(local_48._0_4_,local_58);
    lVar81 = CONCAT44(local_28._0_4_,local_38._0_4_);
    local_48._8_4_ = iStack_54;
    local_48._12_4_ = uVar6;
    local_38._4_4_ = uVar7;
    local_38._0_4_ = (int)uStack_50;
    local_38._12_4_ = local_28._8_4_;
    local_28._8_4_ = uStack_50._4_4_;
    local_28._12_4_ = uVar8;
    _local_58 = lVar73;
    uStack_50 = lVar81;
    goto LAB_00417fbb;
  }
  *(ulong *)coeff = _local_58;
  *(longlong *)(coeff + 2) = uStack_50;
  *(undefined8 *)(coeff + 4) = local_48._0_8_;
  *(undefined8 *)(coeff + 6) = local_48._8_8_;
LAB_00417fe1:
  *(undefined8 *)(coeff + 8) = local_38._0_8_;
  *(undefined8 *)(coeff + 10) = local_38._8_8_;
LAB_00417fe6:
  *(undefined8 *)(coeff + 0xc) = local_28._0_8_;
  *(undefined8 *)(coeff + 0xe) = local_28._8_8_;
  return;
}

Assistant:

void av1_fwd_txfm2d_4x4_sse4_1(const int16_t *input, int32_t *coeff,
                               int input_stride, TX_TYPE tx_type, int bd) {
  __m128i in[4];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X4];
  const int txw_idx = get_txw_idx(TX_4X4);
  const int txh_idx = get_txh_idx(TX_4X4);

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case ADST_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case DCT_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case ADST_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case FLIPADST_DCT:
      load_buffer_4x4(input, in, input_stride, 1, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case DCT_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 0, 1, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 1, 1, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case ADST_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 0, 1, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case FLIPADST_ADST:
      load_buffer_4x4(input, in, input_stride, 1, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case IDTX:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case V_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case H_DCT:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fdct4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case V_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case H_ADST:
      load_buffer_4x4(input, in, input_stride, 0, 0, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_col[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case V_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 1, 0, shift[0]);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    case H_FLIPADST:
      load_buffer_4x4(input, in, input_stride, 0, 1, shift[0]);
      idtx4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      transpose_32bit_4x4(in, in);
      fadst4x4_sse4_1(in, in, av1_fwd_cos_bit_row[txw_idx][txh_idx], 1);
      write_buffer_4x4(in, coeff);
      break;
    default: assert(0);
  }
  (void)bd;
}